

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textool.cpp
# Opt level: O0

char * getGlErrStr(GLenum err)

{
  char *pcStack_10;
  GLenum err_local;
  
  if (err == 0) {
    pcStack_10 = "GL_NO_ERROR";
  }
  else if (err == 0x500) {
    pcStack_10 = "GL_INVALID_ENUM";
  }
  else if (err == 0x501) {
    pcStack_10 = "GL_INVALID_VALUE";
  }
  else if (err == 0x502) {
    pcStack_10 = "GL_INVALID_OPERATION";
  }
  else if (err == 0x505) {
    pcStack_10 = "GL_OUT_OF_MEMORY";
  }
  else {
    if (err != 0x506) {
      __assert_fail("!\"unknown error\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/textool/textool.cpp"
                    ,0x23,"const char *getGlErrStr(const GLenum)");
    }
    pcStack_10 = "GL_INVALID_FRAMEBUFFER_OPERATION";
  }
  return pcStack_10;
}

Assistant:

static const char* getGlErrStr(GLenum const err)
{
    switch (err) {
    case GL_NO_ERROR: return "GL_NO_ERROR";
    case GL_INVALID_ENUM: return "GL_INVALID_ENUM";
    case GL_INVALID_VALUE: return "GL_INVALID_VALUE";
    case GL_INVALID_OPERATION: return "GL_INVALID_OPERATION";
    case GL_INVALID_FRAMEBUFFER_OPERATION: return "GL_INVALID_FRAMEBUFFER_OPERATION";
    case GL_OUT_OF_MEMORY: return "GL_OUT_OF_MEMORY";
#ifdef GL_STACK_UNDERFLOW
    case GL_STACK_UNDERFLOW: return "GL_STACK_UNDERFLOW";
#endif
#ifdef GL_STACK_OVERFLOW
    case GL_STACK_OVERFLOW: return "GL_STACK_OVERFLOW";
#endif
    default:
        assert(!"unknown error");
        return nullptr;
    }
}